

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQClosure::Mark(SQClosure *this,SQCollectable **chain)

{
  SQFunctionProto *pSVar1;
  long local_30;
  SQInteger k;
  SQInteger i;
  SQFunctionProto *fp;
  SQCollectable **chain_local;
  SQClosure *this_local;
  
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->super_SQCollectable).super_SQRefCounted._uiRef | 0x80000000;
    if (this->_base != (SQClass *)0x0) {
      (*(this->_base->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])
                (this->_base,chain);
    }
    pSVar1 = this->_function;
    (*(pSVar1->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])(pSVar1,chain);
    for (k = 0; k < pSVar1->_noutervalues; k = k + 1) {
      SQSharedState::MarkObject(this->_outervalues + k,(SQCollectable_conflict **)chain);
    }
    for (local_30 = 0; local_30 < pSVar1->_ndefaultparams; local_30 = local_30 + 1) {
      SQSharedState::MarkObject(this->_defaultparams + local_30,(SQCollectable_conflict **)chain);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
  }
  return;
}

Assistant:

void SQClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_base) _base->Mark(chain);
        SQFunctionProto *fp = _function;
        fp->Mark(chain);
        for(SQInteger i = 0; i < fp->_noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
        for(SQInteger k = 0; k < fp->_ndefaultparams; k++) SQSharedState::MarkObject(_defaultparams[k], chain);
    END_MARK()
}